

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mutexes.c
# Opt level: O3

int run_test_thread_rwlock_trylock(void)

{
  int iVar1;
  undefined8 *extraout_RDX;
  uv_rwlock_t *unaff_RBX;
  int iVar2;
  int64_t eval_b;
  int64_t eval_b_3;
  uv_thread_t thread;
  undefined1 auStack_a8 [16];
  code *pcStack_98;
  long lStack_90;
  long lStack_88;
  undefined1 auStack_80 [16];
  uv_cond_t *puStack_70;
  long lStack_68;
  long lStack_60;
  uv_rwlock_t *puStack_58;
  long local_10;
  
  iVar1 = uv_cond_init(&condvar);
  local_10 = (long)iVar1;
  if (local_10 == 0) {
    iVar1 = uv_mutex_init(&mutex);
    local_10 = (long)iVar1;
    if (local_10 != 0) goto LAB_001ae5f3;
    iVar1 = uv_rwlock_init(&rwlock);
    local_10 = (long)iVar1;
    if (local_10 != 0) goto LAB_001ae602;
    uv_mutex_lock(&mutex);
    iVar1 = uv_thread_create(&local_10,thread_rwlock_trylock_peer,0);
    if (iVar1 != 0) goto LAB_001ae611;
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != 0) goto LAB_001ae620;
    synchronize();
    unaff_RBX = &rwlock;
    uv_rwlock_wrunlock(&rwlock);
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_001ae62f;
    synchronize();
    unaff_RBX = &rwlock;
    uv_rwlock_rdunlock(&rwlock);
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001ae63e;
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001ae64d;
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_001ae65c;
    unaff_RBX = &rwlock;
    uv_rwlock_rdunlock(&rwlock);
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001ae66b;
    synchronize();
    iVar1 = uv_thread_join(&local_10);
    if (iVar1 == 0) {
      uv_rwlock_destroy(&rwlock);
      uv_mutex_unlock(&mutex);
      uv_mutex_destroy(&mutex);
      uv_cond_destroy(&condvar);
      return 0;
    }
  }
  else {
    run_test_thread_rwlock_trylock_cold_1();
LAB_001ae5f3:
    run_test_thread_rwlock_trylock_cold_2();
LAB_001ae602:
    run_test_thread_rwlock_trylock_cold_3();
LAB_001ae611:
    run_test_thread_rwlock_trylock_cold_4();
LAB_001ae620:
    run_test_thread_rwlock_trylock_cold_5();
LAB_001ae62f:
    run_test_thread_rwlock_trylock_cold_6();
LAB_001ae63e:
    run_test_thread_rwlock_trylock_cold_7();
LAB_001ae64d:
    run_test_thread_rwlock_trylock_cold_8();
LAB_001ae65c:
    run_test_thread_rwlock_trylock_cold_9();
LAB_001ae66b:
    run_test_thread_rwlock_trylock_cold_10();
  }
  run_test_thread_rwlock_trylock_cold_11();
  uv_mutex_lock(&mutex);
  iVar1 = uv_rwlock_tryrdlock(&rwlock);
  if (iVar1 == -0x10) {
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001ae7f8;
    synchronize();
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 != 0) goto LAB_001ae805;
    unaff_RBX = &rwlock;
    uv_rwlock_rdunlock(&rwlock);
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != -0x10) goto LAB_001ae812;
    synchronize();
    iVar1 = uv_rwlock_trywrlock(&rwlock);
    if (iVar1 != 0) goto LAB_001ae81f;
    synchronize();
    unaff_RBX = &rwlock;
    uv_rwlock_wrunlock(&rwlock);
    iVar1 = uv_rwlock_tryrdlock(&rwlock);
    if (iVar1 == 0) {
      synchronize();
      uv_rwlock_rdunlock(&rwlock);
      step = step + 1;
      uv_cond_signal(&condvar);
      iVar1 = uv_mutex_unlock(&mutex);
      return iVar1;
    }
  }
  else {
    thread_rwlock_trylock_peer_cold_1();
LAB_001ae7f8:
    thread_rwlock_trylock_peer_cold_2();
LAB_001ae805:
    thread_rwlock_trylock_peer_cold_3();
LAB_001ae812:
    thread_rwlock_trylock_peer_cold_4();
LAB_001ae81f:
    thread_rwlock_trylock_peer_cold_5();
  }
  thread_rwlock_trylock_peer_cold_6();
  step = step + 1;
  puStack_70 = (uv_cond_t *)0x1ae857;
  puStack_58 = unaff_RBX;
  uv_cond_signal(&condvar);
  iVar1 = step;
  lStack_68 = (long)step;
  do {
    puStack_70 = (uv_cond_t *)0x1ae870;
    uv_cond_wait(&condvar,&mutex);
    lStack_60 = (long)step;
  } while (iVar1 == step);
  lStack_68 = lStack_68 + 1;
  if (lStack_60 == lStack_68) {
    return step;
  }
  puStack_70 = (uv_cond_t *)0x1ae8aa;
  synchronize_cold_1();
  puStack_70 = &condvar;
  iVar2 = (int)&lStack_90;
  pcStack_98 = (code *)0x1ae8c7;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_80);
  lStack_88 = (long)iVar1;
  lStack_90 = 0;
  if (lStack_88 == 0) {
    pcStack_98 = (code *)0x1ae8f1;
    iVar1 = uv_loop_init(&loop);
    lStack_88 = (long)iVar1;
    lStack_90 = 0;
    if (lStack_88 != 0) goto LAB_001aea97;
    pcStack_98 = (code *)0x1ae922;
    iVar1 = uv_tcp_init(&loop,&tcp_client);
    lStack_88 = (long)iVar1;
    lStack_90 = 0;
    if (lStack_88 != 0) goto LAB_001aeaa4;
    pcStack_98 = (code *)0x1ae95f;
    iVar1 = uv_tcp_connect(&connect_req,&tcp_client,auStack_80,connect_cb);
    lStack_88 = (long)iVar1;
    lStack_90 = 0;
    if (lStack_88 != 0) goto LAB_001aeab1;
    pcStack_98 = (code *)0x1ae98b;
    iVar1 = uv_run(&loop,0);
    lStack_88 = (long)iVar1;
    lStack_90 = 0;
    if (lStack_88 != 0) goto LAB_001aeabe;
    lStack_88 = 1;
    lStack_90 = (long)connect_cb_called;
    if (lStack_90 != 1) goto LAB_001aeacb;
    lStack_88 = 1;
    lStack_90 = (long)read_cb_called;
    if (lStack_90 != 1) goto LAB_001aead8;
    lStack_88 = 1;
    lStack_90 = (long)write_cb_called;
    if (lStack_90 != 1) goto LAB_001aeae5;
    lStack_88 = 1;
    lStack_90 = (long)close_cb_called;
    if (lStack_90 != 1) goto LAB_001aeaf2;
    pcStack_98 = (code *)0x1aea4d;
    uv_walk(&loop,close_walk_cb,0);
    pcStack_98 = (code *)0x1aea57;
    uv_run(&loop,0);
    lStack_88 = 0;
    pcStack_98 = (code *)0x1aea68;
    iVar1 = uv_loop_close(&loop);
    lStack_90 = (long)iVar1;
    if (lStack_88 == lStack_90) {
      pcStack_98 = (code *)0x1aea82;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    pcStack_98 = (code *)0x1aea97;
    run_test_not_readable_nor_writable_on_read_error_cold_1();
LAB_001aea97:
    pcStack_98 = (code *)0x1aeaa4;
    run_test_not_readable_nor_writable_on_read_error_cold_2();
LAB_001aeaa4:
    pcStack_98 = (code *)0x1aeab1;
    run_test_not_readable_nor_writable_on_read_error_cold_3();
LAB_001aeab1:
    pcStack_98 = (code *)0x1aeabe;
    run_test_not_readable_nor_writable_on_read_error_cold_4();
LAB_001aeabe:
    pcStack_98 = (code *)0x1aeacb;
    run_test_not_readable_nor_writable_on_read_error_cold_5();
LAB_001aeacb:
    pcStack_98 = (code *)0x1aead8;
    run_test_not_readable_nor_writable_on_read_error_cold_6();
LAB_001aead8:
    pcStack_98 = (code *)0x1aeae5;
    run_test_not_readable_nor_writable_on_read_error_cold_7();
LAB_001aeae5:
    pcStack_98 = (code *)0x1aeaf2;
    run_test_not_readable_nor_writable_on_read_error_cold_8();
LAB_001aeaf2:
    pcStack_98 = (code *)0x1aeaff;
    run_test_not_readable_nor_writable_on_read_error_cold_9();
  }
  pcStack_98 = connect_cb;
  run_test_not_readable_nor_writable_on_read_error_cold_10();
  connect_cb_called = connect_cb_called + 1;
  auStack_a8._0_8_ = SEXT48(iVar2);
  if (auStack_a8._0_8_ == 0) {
    iVar1 = uv_read_start(&tcp_client,alloc_cb,read_cb);
    auStack_a8._0_8_ = SEXT48(iVar1);
    if (auStack_a8._0_8_ == 0) {
      auStack_a8 = uv_buf_init(reset_me_cmd,3);
      iVar1 = uv_write(&write_req,&tcp_client,auStack_a8,1,write_cb);
      pcStack_98 = (code *)0x0;
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_001aebeb;
    }
  }
  else {
    connect_cb_cold_1();
  }
  connect_cb_cold_2();
LAB_001aebeb:
  connect_cb_cold_3();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 0x40;
  return 0x36e800;
}

Assistant:

TEST_IMPL(thread_rwlock_trylock) {
  uv_thread_t thread;

  ASSERT_OK(uv_cond_init(&condvar));
  ASSERT_OK(uv_mutex_init(&mutex));
  ASSERT_OK(uv_rwlock_init(&rwlock));

  uv_mutex_lock(&mutex);
  ASSERT_OK(uv_thread_create(&thread, thread_rwlock_trylock_peer, NULL));

  /* Hold write lock. */
  ASSERT_OK(uv_rwlock_trywrlock(&rwlock));
  synchronize();  /* Releases the mutex to the other thread. */

  /* Release write lock and acquire read lock.  Pthreads doesn't support
   * the notion of upgrading or downgrading rwlocks, so neither do we.
   */
  uv_rwlock_wrunlock(&rwlock);
  ASSERT_OK(uv_rwlock_tryrdlock(&rwlock));
  synchronize();

  /* Release read lock. */
  uv_rwlock_rdunlock(&rwlock);
  synchronize();

  /* Write lock held by other thread. */
  ASSERT_EQ(UV_EBUSY, uv_rwlock_tryrdlock(&rwlock));
  ASSERT_EQ(UV_EBUSY, uv_rwlock_trywrlock(&rwlock));
  synchronize();

  /* Read lock held by other thread. */
  ASSERT_OK(uv_rwlock_tryrdlock(&rwlock));
  uv_rwlock_rdunlock(&rwlock);
  ASSERT_EQ(UV_EBUSY, uv_rwlock_trywrlock(&rwlock));
  synchronize();

  ASSERT_OK(uv_thread_join(&thread));
  uv_rwlock_destroy(&rwlock);
  uv_mutex_unlock(&mutex);
  uv_mutex_destroy(&mutex);
  uv_cond_destroy(&condvar);

  return 0;
}